

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

bool __thiscall
ICM::Compiler::PreliminaryCompile::compileIfSub
          (PreliminaryCompile *this,NodeRange *nr,VecElt *condList,
          vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
          *dolists)

{
  pointer *ppEVar1;
  uint8_t uVar2;
  iterator iVar3;
  pointer pvVar4;
  Element *pEVar5;
  Element *pEVar6;
  uint_t uVar7;
  undefined4 uVar8;
  bool bVar9;
  Element *elt;
  Element *e;
  Element *__args;
  byte bVar10;
  Element *elt_00;
  initializer_list<ICM::ASTBase::Element> __l;
  VecElt elsedolist;
  allocator_type local_69;
  vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> local_68;
  VecElt *local_50;
  vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *local_48;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_40;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_38;
  
  elt_00 = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._begin._M_current;
  elt = adjustElement(this,elt_00);
  checkBoolExp(this,elt);
  iVar3._M_current =
       (condList->super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (condList->super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
    _M_realloc_insert<ICM::ASTBase::Element_const&>
              ((vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)condList,iVar3
               ,elt_00);
  }
  else {
    uVar8 = *(undefined4 *)&elt_00->field_0x4;
    uVar7 = elt_00->index;
    (iVar3._M_current)->field_0 = elt_00->field_0;
    *(undefined4 *)&(iVar3._M_current)->field_0x4 = uVar8;
    (iVar3._M_current)->index = uVar7;
    ppEVar1 = &(condList->
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  local_40._M_current._0_4_ = 0x1b04;
  local_38._M_current = (Element *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            (&local_68,__l,&local_69);
  std::
  vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
  ::emplace_back<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>
            ((vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
              *)dolists,&local_68);
  local_50 = condList;
  if (local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
      _M_impl.super__Vector_impl_data._M_start != (Element *)0x0) {
    operator_delete(local_68.
                    super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (dolists->
           super__Vector_base<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = (vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)(pvVar4 + -1);
  pEVar5 = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._end._M_current;
  pEVar6 = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._begin._M_current;
  do {
    __args = pEVar6 + 1;
    if (__args == pEVar5) {
      bVar10 = 1;
      break;
    }
    if ((__args->field_0).field_0.etype == '\x04') {
      uVar2 = pEVar6[1].field_0.field_0.stype;
      if (uVar2 == '\b') {
        local_40._M_current = pEVar6 + 2;
        if (pEVar5 <= pEVar6 + 2) {
          local_40._M_current = pEVar5;
        }
        local_38._M_current = pEVar5;
        createDoList(&local_68,this,(NodeRange *)&local_40);
        std::
        vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        ::push_back(dolists,&local_68);
        if (local_68.
            super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
            _M_impl.super__Vector_impl_data._M_start != (Element *)0x0) {
          operator_delete(local_68.
                          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        elt_00 = (Element *)0x1;
      }
      else {
        if (uVar2 != '\t') goto LAB_0013f2cc;
        local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
        _M_impl.super__Vector_impl_data._M_start = pEVar6 + 2;
        if (pEVar5 <= pEVar6 + 2) {
          local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
          ._M_impl.super__Vector_impl_data._M_start = pEVar5;
        }
        local_68.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
        _M_impl.super__Vector_impl_data._M_finish = pEVar5;
        bVar9 = compileIfSub(this,(NodeRange *)&local_68,local_50,dolists);
        elt_00 = (Element *)(ulong)bVar9;
      }
      bVar9 = false;
    }
    else {
LAB_0013f2cc:
      iVar3._M_current =
           pvVar4[-1].
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          pvVar4[-1].
          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
        _M_realloc_insert<ICM::ASTBase::Element_const&>(local_48,iVar3,__args);
      }
      else {
        uVar8 = *(undefined4 *)&__args->field_0x4;
        uVar7 = pEVar6[1].index;
        (iVar3._M_current)->field_0 = __args->field_0;
        *(undefined4 *)&(iVar3._M_current)->field_0x4 = uVar8;
        (iVar3._M_current)->index = uVar7;
        ppEVar1 = &pvVar4[-1].
                   super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      bVar9 = true;
    }
    bVar10 = (byte)elt_00;
    pEVar6 = __args;
  } while (bVar9);
  return (bool)(bVar10 & 1);
}

Assistant:

bool compileIfSub(const NodeRange &nr, VecElt &condList, vector<VecElt> &dolists) {
				Element &bexp = *nr.begin();
				checkBoolExp(adjustElement(bexp));
				condList.push_back(bexp);
				dolists.push_back(VecElt{ Element::Keyword(do_) });
				VecElt &dolist = dolists.back();

				auto ib = nr.begin() + 1;
				auto ie = nr.end();
				for (auto iter = ib; iter != ie; ++iter) {
					Element &e = *iter;
					if (e.isKeyword()) {
						if (e.getKeyword() == elsif_) {
							return compileIfSub(rangei(iter + 1, ie), condList, dolists);
						}
						else if (e.getKeyword() == else_) {
							VecElt elsedolist = createDoList(rangei(iter + 1, ie));
							dolists.push_back(elsedolist);
							return true;
						}
					}
					dolist.push_back(e);
				}
				return true;
			}